

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  Node *node_00;
  bool bVar1;
  reference ppNVar2;
  pointer ppVar3;
  byte local_c9;
  _Self local_a8;
  _Self local_a0;
  iterator want_e;
  Edge *edge;
  Node *n;
  _Self local_78;
  iterator i;
  undefined1 local_60 [8];
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  string *err_local;
  Node *node_local;
  DependencyScan *scan_local;
  Plan *this_local;
  
  dependents._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  local_78._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
                 ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
  do {
    n = (Node *)std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end
                          ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
    bVar1 = std::operator!=(&local_78,(_Self *)&n);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_0010e1d5:
      std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::~set
                ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)local_60);
      return this_local._7_1_;
    }
    ppNVar2 = std::_Rb_tree_const_iterator<Node_*>::operator*(&local_78);
    node_00 = *ppNVar2;
    bVar1 = DependencyScan::RecomputeDirty
                      (scan,node_00,
                       (string *)dependents._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0010e1d5;
    }
    bVar1 = Node::dirty(node_00);
    if (bVar1) {
      want_e._M_node = (_Base_ptr)Node::in_edge(node_00);
      local_c9 = 0;
      if ((Edge *)want_e._M_node != (Edge *)0x0) {
        bVar1 = Edge::outputs_ready((Edge *)want_e._M_node);
        local_c9 = bVar1 ^ 0xff;
      }
      if ((local_c9 & 1) == 0) {
        __assert_fail("edge && !edge->outputs_ready()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                      ,0x272,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::find(&this->want_,(key_type *)&want_e);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::end(&this->want_);
      bVar1 = std::operator!=(&local_a0,&local_a8);
      if (!bVar1) {
        __assert_fail("want_e != want_.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                      ,0x274,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      ppVar3 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_a0);
      if (ppVar3->second == kWantNothing) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->(&local_a0);
        ppVar3->second = kWantToStart;
        EdgeWanted(this,(Edge *)want_e._M_node);
      }
    }
    std::_Rb_tree_const_iterator<Node_*>::operator++(&local_78);
  } while( true );
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    if (!scan->RecomputeDirty(n, err))
      return false;
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}